

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

int Abc_NtkFinRefinement
              (Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes,
              Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2,Vec_Wec_t *vResult)

{
  uint uVar1;
  int Entry;
  void *__ptr;
  undefined1 auVar2 [16];
  bool bVar3;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar4;
  Vec_Wrd_t *vSims;
  word *__s;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int nWords;
  int iVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  size_t __size;
  uint uVar12;
  ulong uVar13;
  undefined4 uVar14;
  uint uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  ulong local_c8;
  Vec_Int_t *local_b8;
  int Types [2];
  int Objs [2];
  long lVar19;
  
  p = (Vec_Wec_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pVVar4 = (Vec_Int_t *)calloc(100,0x10);
  p->pArray = pVVar4;
  nWords = ((vList->nSize >> 6) + 1) - (uint)((vList->nSize & 0x3fU) == 0);
  iVar11 = pNtk->vObjs->nSize;
  lVar16 = (long)nWords * (long)iVar11;
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar22 = (int)lVar16;
  iVar8 = iVar22;
  if (iVar22 - 1U < 0xf) {
    iVar8 = 0x10;
  }
  vSims->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar8 << 3);
  }
  vSims->pArray = __s;
  vSims->nSize = iVar22;
  memset(__s,0,lVar16 * 8);
  iVar22 = iVar11 * 2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar22 - 1U) {
    iVar8 = iVar22;
  }
  pVVar4->nCap = iVar8;
  if (iVar8 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = iVar22;
  }
  else {
    piVar5 = (int *)malloc((long)iVar8 << 2);
    pVVar4->pArray = piVar5;
    pVVar4->nSize = iVar22;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,(long)iVar11 << 3);
    }
  }
  pVVar6 = Vec_WecPushLevel(p);
  Abc_NtkFinLocalSetup(vPairs,vList,vMap2,pVVar6);
  uVar14 = 0;
  bVar3 = true;
  do {
    bVar10 = bVar3;
    uVar1 = vCis->nSize;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    uVar15 = uVar1;
    if (uVar1 - 1 < 0xf) {
      uVar15 = 0x10;
    }
    pVVar6->nCap = uVar15;
    if (uVar15 == 0) {
      pVVar6->pArray = (int *)0x0;
      if (0 < (int)uVar1) {
        __size = (ulong)uVar1 * 4;
LAB_002b6315:
        piVar5 = (int *)malloc(__size);
        goto LAB_002b631d;
      }
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar15 << 2);
      pVVar6->pArray = piVar5;
      if ((int)uVar15 < (int)uVar1) {
        __size = (long)(int)uVar1 << 2;
        if (piVar5 == (int *)0x0) goto LAB_002b6315;
        piVar5 = (int *)realloc(piVar5,__size);
LAB_002b631d:
        pVVar6->pArray = piVar5;
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar6->nCap = uVar1;
      }
      auVar2 = _DAT_0094e250;
      if (0 < (int)uVar1) {
        lVar16 = (ulong)uVar1 - 1;
        auVar17._8_4_ = (int)lVar16;
        auVar17._0_8_ = lVar16;
        auVar17._12_4_ = (int)((ulong)lVar16 >> 0x20);
        auVar17 = auVar17 ^ _DAT_0094e250;
        lVar16 = 0;
        auVar18 = _DAT_0094e240;
        auVar20 = _DAT_0094f530;
        do {
          auVar21 = auVar18 ^ auVar2;
          iVar11 = auVar17._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar11 && auVar17._0_4_ < auVar21._0_4_ ||
                      iVar11 < auVar21._4_4_) & 1)) {
            *(undefined4 *)((long)piVar5 + lVar16) = uVar14;
          }
          if ((auVar21._12_4_ != auVar17._12_4_ || auVar21._8_4_ <= auVar17._8_4_) &&
              auVar21._12_4_ <= auVar17._12_4_) {
            *(undefined4 *)((long)piVar5 + lVar16 + 4) = uVar14;
          }
          auVar21 = auVar20 ^ auVar2;
          iVar22 = auVar21._4_4_;
          if (iVar22 <= iVar11 && (iVar22 != iVar11 || auVar21._0_4_ <= auVar17._0_4_)) {
            *(undefined4 *)((long)piVar5 + lVar16 + 8) = uVar14;
            *(undefined4 *)((long)piVar5 + lVar16 + 0xc) = uVar14;
          }
          lVar19 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 4;
          auVar18._8_8_ = lVar19 + 4;
          lVar19 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar19 + 4;
          lVar16 = lVar16 + 0x10;
        } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar16);
      }
    }
    pVVar6->nSize = uVar1;
    Abc_NtkFinSimulateOne(pNtk,vTypes,vCos,vCis,vNodes,vMap2,pVVar6,vSims,nWords,vPairs,p,0,1);
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
    uVar14 = 1;
    bVar3 = false;
  } while (bVar10);
  local_c8 = (ulong)(uint)p->nSize;
  if (p->nSize < 1) {
    Abc_NtkFinLocalSetdown(vPairs,vList,vMap2);
    pVVar6 = p->pArray;
    iVar11 = 0;
  }
  else {
    local_b8 = p->pArray;
    lVar16 = 0;
    iVar11 = 0;
    do {
      if (local_b8[lVar16].nSize < 1) {
LAB_002b6994:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (3 < (uint)local_b8[lVar16].nSize) {
        pVVar6 = local_b8 + lVar16;
        iVar22 = *pVVar6->pArray;
        uVar1 = iVar22 * 2 + 1;
        uVar15 = 2;
        uVar13 = 3;
        do {
          if ((((int)uVar15 < 0) || (iVar22 < 0)) ||
             (uVar9 = vPairs->nSize, (int)uVar9 <= iVar22 * 2)) goto LAB_002b6994;
          iVar8 = pVVar6->pArray[uVar15];
          Entry = pVVar6->pArray[uVar13];
          piVar5 = vPairs->pArray;
          Objs[0] = piVar5[(uint)(iVar22 * 2)];
          if (((iVar8 < 0) || (uVar12 = iVar8 * 2, uVar9 <= uVar12)) ||
             (Objs[1] = piVar5[uVar12], uVar9 <= uVar1)) goto LAB_002b6994;
          Types[0] = piVar5[uVar1];
          if (uVar9 <= (uVar12 | 1)) goto LAB_002b6994;
          Types[1] = piVar5[uVar12 | 1];
          pVVar7 = Abc_NtkFinCheckPair(pNtk,vTypes,vCos,vCis,vNodes,Objs,Types,pVVar4);
          if (pVVar7 == (Vec_Int_t *)0x0) {
            uVar15 = uVar15 + 2;
          }
          else {
            if (pVVar6->nSize <= (int)uVar15) goto LAB_002b6994;
            if (pVVar6->pArray[uVar15] != iVar8) {
              __assert_fail("Vec_IntEntry(vClass, k) == iFin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                            ,0x3ec,
                            "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                           );
            }
            if (pVVar7->nSize == 0) {
              pVVar6 = Vec_WecPushLevel(p);
              Vec_IntPush(pVVar6,iVar8);
              Vec_IntPush(pVVar6,Entry);
              if (p->nSize <= lVar16) goto LAB_002b69b3;
              pVVar6 = p->pArray;
              if (pVVar6[lVar16].nSize <= (int)(uint)uVar13) {
LAB_002b69f1:
                __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
              }
              uVar9 = pVVar6[lVar16].nSize - 1;
              pVVar6[lVar16].nSize = uVar9;
              if ((uint)uVar13 < uVar9) {
                piVar5 = pVVar6[lVar16].pArray + uVar13;
                do {
                  *piVar5 = piVar5[1];
                  uVar9 = pVVar6[lVar16].nSize;
                  uVar12 = (int)uVar13 + 1;
                  uVar13 = (ulong)uVar12;
                  piVar5 = piVar5 + 1;
                } while ((int)uVar12 < (int)uVar9);
              }
              if ((int)uVar9 <= (int)uVar15) goto LAB_002b69f1;
              pVVar6[lVar16].nSize = uVar9 - 1;
              if (uVar15 < uVar9 - 1) {
                piVar5 = pVVar6[lVar16].pArray + uVar15;
                uVar9 = uVar15;
                do {
                  *piVar5 = piVar5[1];
                  uVar9 = uVar9 + 1;
                  piVar5 = piVar5 + 1;
                } while ((int)uVar9 < pVVar6[lVar16].nSize);
              }
            }
            else {
              Abc_NtkFinSimulateOne
                        (pNtk,vTypes,vCos,vCis,vNodes,vMap2,pVVar7,vSims,nWords,vPairs,p,(int)lVar16
                         ,uVar15 >> 1);
            }
            if (pVVar7->pArray != (int *)0x0) {
              free(pVVar7->pArray);
            }
            free(pVVar7);
            local_c8 = (ulong)p->nSize;
            if ((long)local_c8 <= lVar16) {
LAB_002b69b3:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            local_b8 = p->pArray;
            pVVar6 = local_b8 + lVar16;
            if (((int)uVar15 < local_b8[lVar16].nSize) && (pVVar6->pArray[uVar15] == iVar8)) {
              __assert_fail("Vec_IntSize(vClass) <= k || Vec_IntEntry(vClass, k) != iFin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                            ,0x3fa,
                            "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                           );
            }
          }
          iVar11 = iVar11 + 1;
          uVar13 = (ulong)(uVar15 + 1);
        } while ((int)(uVar15 + 1) < pVVar6->nSize);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)local_c8);
    Abc_NtkFinLocalSetdown(vPairs,vList,vMap2);
    pVVar6 = p->pArray;
    if (0 < (int)local_c8) {
      uVar13 = 0;
      do {
        if ((pVVar6[uVar13].nSize & 1U) != 0) {
          __assert_fail("Vec_IntSize(vArray) % 2 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                        ,0x404,
                        "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                       );
        }
        if (2 < pVVar6[uVar13].nSize) {
          pVVar7 = Vec_WecPushLevel(vResult);
          if (1 < pVVar6[uVar13].nSize) {
            lVar16 = 0;
            do {
              Vec_IntPush(pVVar7,pVVar6[uVar13].pArray[lVar16]);
              iVar22 = (int)lVar16;
              lVar16 = lVar16 + 2;
            } while (iVar22 + 3 < pVVar6[uVar13].nSize);
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != (local_c8 & 0xffffffff));
    }
  }
  iVar22 = p->nCap;
  if ((long)iVar22 < 1) {
    if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_002b6941;
  }
  else {
    lVar16 = 0;
    do {
      __ptr = *(void **)((long)&pVVar6->pArray + lVar16);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar6->pArray + lVar16) = 0;
      }
      lVar16 = lVar16 + 0x10;
    } while ((long)iVar22 * 0x10 != lVar16);
  }
  free(pVVar6);
LAB_002b6941:
  free(p);
  if (__s != (word *)0x0) {
    free(__s);
  }
  free(vSims);
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  return iVar11;
}

Assistant:

int Abc_NtkFinRefinement( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, 
                          Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2, Vec_Wec_t * vResult )
{
    Vec_Wec_t * vRes  = Vec_WecAlloc( 100 );
    int nWords = Abc_Bit6WordNum( Vec_IntSize(vList) );
    Vec_Wrd_t * vSims = Vec_WrdStart( nWords * Abc_NtkObjNumMax(pNtk) );  // simulation info for each object
    Vec_Int_t * vLits = Vec_IntStart( 2*Abc_NtkObjNumMax(pNtk) );         // two literals for each object
    Vec_Int_t * vPat, * vClass, * vArray;  
    int i, k, iFin, Index, nCalls = 0;
    // prepare
    vArray = Vec_WecPushLevel( vRes );
    Abc_NtkFinLocalSetup( vPairs, vList, vMap2, vArray );
    // try all-0/all-1 pattern
    for ( i = 0; i < 2; i++ )
    {
        vPat = Vec_IntAlloc( Vec_IntSize(vCis) );
        Vec_IntFill( vPat, Vec_IntSize(vCis), i );
        Abc_NtkFinSimulateOne( pNtk, vTypes, vCos, vCis, vNodes, vMap2, vPat, vSims, nWords, vPairs, vRes, 0, 1 );
        Vec_IntFree( vPat );
    }
    // explore the classes
    //Vec_WecPrint( vRes, 0 );
    Vec_WecForEachLevel( vRes, vClass, i )
    {
        int iFin0  = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryDoubleStart( vClass, iFin, Index, k, 2 )
        {
            int Objs[2]  = { Vec_IntEntry(vPairs, 2*iFin0),   Vec_IntEntry(vPairs, 2*iFin)   }; 
            int Types[2] = { Vec_IntEntry(vPairs, 2*iFin0+1), Vec_IntEntry(vPairs, 2*iFin+1) }; 
            nCalls++;
            //printf( "Checking pair %d and %d.\n", iFin0, iFin );
            vPat = Abc_NtkFinCheckPair( pNtk, vTypes, vCos, vCis, vNodes, Objs, Types, vLits );
            if ( vPat == NULL ) // proved
                continue;
            assert( Vec_IntEntry(vClass, k) == iFin );
            if ( Vec_IntSize(vPat) == 0 )
            {
                Vec_Int_t * vNewClass = Vec_WecPushLevel( vRes );
                Vec_IntPushTwo( vNewClass, iFin, Index );  // index and first entry
                vClass = Vec_WecEntry( vRes, i );
                Vec_IntDrop( vClass, k+1 );
                Vec_IntDrop( vClass, k );
            }
            else // resimulate and refine
                Abc_NtkFinSimulateOne( pNtk, vTypes, vCos, vCis, vNodes, vMap2, vPat, vSims, nWords, vPairs, vRes, i, k/2 );
            Vec_IntFree( vPat );
            // make sure refinement happened (k'th entry is now absent or different)
            vClass = Vec_WecEntry( vRes, i );
            assert( Vec_IntSize(vClass) <= k || Vec_IntEntry(vClass, k) != iFin );
            k -= 2;
            //Vec_WecPrint( vRes, 0 );
        }
    }
    // unprepare
    Abc_NtkFinLocalSetdown( vPairs, vList, vMap2 );
    // reload proved equivs into the final array
    Vec_WecForEachLevel( vRes, vArray, i )
    {
        assert( Vec_IntSize(vArray) % 2 == 0 );
        if ( Vec_IntSize(vArray) <= 2 )
            continue;
        vClass = Vec_WecPushLevel( vResult );
        Vec_IntForEachEntryDouble( vArray, iFin, Index, k )
            Vec_IntPush( vClass, iFin );
    }
    Vec_WecFree( vRes );
    Vec_WrdFree( vSims );
    Vec_IntFree( vLits );
    return nCalls;
}